

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int parsedate(char *date,time_t *output)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  long slnum;
  time_t tVar5;
  bool bVar6;
  int local_c8;
  int old_errno;
  int error;
  long lval;
  time_t *ptStack_a0;
  int len_1;
  char *end;
  size_t sStack_90;
  int val;
  size_t len;
  char buf [32];
  int local_5c;
  _Bool found;
  int part;
  char *indate;
  int local_48;
  assume dignext;
  int tzoff;
  int yearnum;
  int secnum;
  int minnum;
  int hournum;
  int mdaynum;
  int monnum;
  int wdaynum;
  time_t t;
  time_t *output_local;
  char *date_local;
  
  _monnum = 0;
  mdaynum = -1;
  hournum = -1;
  minnum = -1;
  secnum = -1;
  yearnum = -1;
  tzoff = -1;
  dignext = ~DATE_MDAY;
  local_48 = -1;
  bVar2 = false;
  local_5c = 0;
  t = (time_t)output;
  output_local = (time_t *)date;
  do {
    if ((char)*output_local == '\0' || 5 < local_5c) {
      if (tzoff == -1) {
        secnum = 0;
        yearnum = 0;
        tzoff = 0;
      }
      if (((minnum == -1) || (hournum == -1)) || (dignext == ~DATE_MDAY)) {
        date_local._4_4_ = -1;
      }
      else if ((int)dignext < 0x62f) {
        date_local._4_4_ = -1;
      }
      else if (((minnum < 0x20) && (hournum < 0xc)) &&
              ((secnum < 0x18 && ((yearnum < 0x3c && (tzoff < 0x3d)))))) {
        tVar5 = time2epoch(tzoff,yearnum,secnum,minnum,hournum,dignext);
        if (local_48 == -1) {
          local_48 = 0;
        }
        if ((local_48 < 1) || (tVar5 <= 0x7fffffffffffffff - (long)local_48)) {
          *(long *)t = local_48 + tVar5;
          date_local._4_4_ = 0;
        }
        else {
          *(undefined8 *)t = 0x7fffffffffffffff;
          date_local._4_4_ = 1;
        }
      }
      else {
        date_local._4_4_ = -1;
      }
      return date_local._4_4_;
    }
    bVar6 = false;
    skip((char **)&output_local);
    iVar3 = Curl_isalpha((uint)(byte)*output_local);
    if (iVar3 == 0) {
      iVar3 = Curl_isdigit((uint)(byte)*output_local);
      if (iVar3 != 0) {
        lval._4_4_ = 0;
        if ((tzoff == -1) &&
           (iVar3 = __isoc99_sscanf(output_local,"%02d:%02d:%02d%n",&secnum,&yearnum,&tzoff,
                                    (long)&lval + 4), iVar3 == 3)) {
          output_local = (time_t *)((long)output_local + (long)lval._4_4_);
        }
        else if ((tzoff == -1) &&
                (iVar3 = __isoc99_sscanf(output_local,"%02d:%02d%n",&secnum,&yearnum,(long)&lval + 4
                                        ), iVar3 == 2)) {
          output_local = (time_t *)((long)output_local + (long)lval._4_4_);
          tzoff = 0;
        }
        else {
          piVar4 = __errno_location();
          iVar3 = *piVar4;
          piVar4 = __errno_location();
          *piVar4 = 0;
          slnum = strtol((char *)output_local,(char **)&stack0xffffffffffffff60,10);
          piVar4 = __errno_location();
          iVar1 = *piVar4;
          piVar4 = __errno_location();
          if (*piVar4 != iVar3) {
            piVar4 = __errno_location();
            *piVar4 = iVar3;
          }
          if (iVar1 != 0) {
            return -1;
          }
          if ((0x7fffffff < slnum) || (slnum < -0x80000000)) {
            return -1;
          }
          end._4_4_ = curlx_sltosi(slnum);
          if (((((local_48 == -1) && ((long)ptStack_a0 - (long)output_local == 4)) &&
               ((int)end._4_4_ < 0x579)) && (date < output_local)) &&
             ((*(char *)((long)output_local + -1) == '+' ||
              (*(char *)((long)output_local + -1) == '-')))) {
            bVar6 = true;
            iVar3 = ((int)end._4_4_ / 100) * 0x3c + (int)end._4_4_ % 100;
            local_c8 = iVar3 * 0x3c;
            if (*(char *)((long)output_local + -1) == '+') {
              local_c8 = iVar3 * -0x3c;
            }
            local_48 = local_c8;
          }
          if ((((long)ptStack_a0 - (long)output_local == 8) && (dignext == ~DATE_MDAY)) &&
             ((hournum == -1 && (minnum == -1)))) {
            bVar6 = true;
            dignext = (int)end._4_4_ / 10000;
            hournum = (int)((long)((ulong)(uint)((int)((long)(int)end._4_4_ % 10000) >> 0x1f) <<
                                   0x20 | (long)(int)end._4_4_ % 10000 & 0xffffffffU) / 100) + -1;
            minnum = (int)end._4_4_ % 100;
          }
          if (((!bVar6) && (!bVar2)) && (minnum == -1)) {
            if ((0 < (int)end._4_4_) && ((int)end._4_4_ < 0x20)) {
              bVar6 = true;
              minnum = end._4_4_;
            }
            bVar2 = true;
          }
          if (((!bVar6) && (bVar2)) && (dignext == ~DATE_MDAY)) {
            bVar6 = true;
            dignext = end._4_4_;
            if ((int)end._4_4_ < 100) {
              if ((int)end._4_4_ < 0x47) {
                dignext = end._4_4_ + 2000;
              }
              else {
                dignext = end._4_4_ + 0x76c;
              }
            }
            if (minnum == -1) {
              bVar2 = false;
            }
          }
          if (!bVar6) {
            return -1;
          }
          output_local = ptStack_a0;
        }
      }
    }
    else {
      memset(&len,0,0x20);
      iVar3 = __isoc99_sscanf(output_local,
                              "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",&len);
      if (iVar3 == 0) {
        sStack_90 = 0;
      }
      else {
        sStack_90 = strlen((char *)&len);
      }
      if (mdaynum == -1) {
        mdaynum = checkday((char *)&len,sStack_90);
        bVar6 = mdaynum != -1;
      }
      if (((!bVar6) && (hournum == -1)) && (hournum = checkmonth((char *)&len), hournum != -1)) {
        bVar6 = true;
      }
      if (((!bVar6) && (local_48 == -1)) && (local_48 = checktz((char *)&len), local_48 != -1)) {
        bVar6 = true;
      }
      if (!bVar6) {
        return -1;
      }
      output_local = (time_t *)(sStack_90 + (long)output_local);
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      int len = 0;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d%n",
                      &hournum, &minnum, &secnum, &len))) {
        /* time stamp! */
        date += len;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d%n", &hournum, &minnum, &len))) {
        /* time stamp without seconds */
        date += len;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  /* time2epoch() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  t = time2epoch(secnum, minnum, hournum, mdaynum, monnum, yearnum);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}